

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

_Bool sysbvm_tuple_equals(sysbvm_context_t *context,sysbvm_tuple_t a,sysbvm_tuple_t b)

{
  ulong uVar1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t local_28;
  sysbvm_tuple_t local_20;
  
  uVar1 = a & 0xf;
  psVar2 = (sysbvm_tuple_t *)a;
  if (uVar1 != 0 || a == 0) {
    if ((int)uVar1 == 0xf) {
      if (0x5f < a) goto LAB_001391f6;
      psVar2 = (context->roots).immediateTrivialTypeTable + (a >> 4);
    }
    else {
      psVar2 = (context->roots).immediateTypeTable + uVar1;
    }
  }
  if ((*psVar2 != 0) && (sVar3 = sysbvm_type_getEqualsFunction(context,*psVar2), sVar3 != 0)) {
    local_28 = a;
    local_20 = b;
    sVar3 = sysbvm_function_apply(context,sVar3,2,&local_28,0);
    return sVar3 == 0x1f;
  }
LAB_001391f6:
  return a == b;
}

Assistant:

SYSBVM_API bool sysbvm_tuple_equals(sysbvm_context_t *context, sysbvm_tuple_t a, sysbvm_tuple_t b)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, a);
    if(type)
    {
        sysbvm_tuple_t equalsFunction = sysbvm_type_getEqualsFunction(context, type);
        if(equalsFunction)
            return sysbvm_tuple_boolean_decode(sysbvm_function_apply2(context, equalsFunction, a, b));
    }

    return sysbvm_tuple_identityEquals(a, b);
}